

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser.cc
# Opt level: O3

bool __thiscall ManifestParser::ParseEdge(ManifestParser *this,string *err)

{
  Lexer *this_00;
  pointer *pppEVar1;
  BindingEnv *pBVar2;
  StringPiece path;
  StringPiece path_00;
  StringPiece path_01;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  Rule *pRVar8;
  Edge *pEVar9;
  Pool *pPVar10;
  long *plVar11;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> _Var12;
  Node *pNVar13;
  undefined8 *puVar14;
  _Rb_tree_header *p_Var15;
  ulong uVar16;
  size_type *psVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  pointer ppVar20;
  pointer this_01;
  int iVar21;
  string dyndep;
  string pool_name;
  EvalString val;
  string rule_name;
  uint64_t slash_bits_1;
  vector<EvalString,_std::allocator<EvalString>_> outs;
  vector<EvalString,_std::allocator<EvalString>_> ins;
  uint64_t slash_bits_2;
  uint64_t slash_bits;
  undefined1 local_170 [32];
  ManifestParser *local_150;
  undefined1 local_148 [40];
  string *local_120;
  undefined1 local_118 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  int local_d0;
  int local_cc;
  BindingEnv *local_c8;
  Edge *local_c0;
  string local_b8;
  vector<EvalString,_std::allocator<EvalString>_> local_98;
  vector<EvalString,_std::allocator<EvalString>_> local_78;
  Rule *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  uint64_t local_38;
  
  local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_start = (EvalString *)0x0;
  local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_finish = (EvalString *)0x0;
  local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8._M_allocated_capacity = 0;
  local_f8._M_allocated_capacity = 0;
  local_f8._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  this_00 = &(this->super_Parser).lexer_;
  local_150 = this;
  bVar5 = Lexer::ReadEvalString(this_00,(EvalString *)&local_f8,true,err);
  if (bVar5) {
    do {
      if (local_f8._M_allocated_capacity == local_f8._8_8_) {
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                   *)&local_f8);
        bVar5 = Lexer::PeekToken(this_00,PIPE);
        iVar21 = 0;
        if (!bVar5) goto LAB_00117897;
        iVar21 = 0;
        goto LAB_0011782e;
      }
      std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                (&local_98,(value_type *)&local_f8);
      uVar4 = local_f8._8_8_;
      uVar3 = local_f8._M_allocated_capacity;
      if (local_f8._8_8_ != local_f8._M_allocated_capacity) {
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_f8._M_allocated_capacity + 0x10);
        do {
          plVar11 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (paVar18 + -1))->_M_dataplus)._M_p;
          if (paVar18 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar11) {
            operator_delete(plVar11,paVar18->_M_allocated_capacity + 1);
          }
          paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)paVar18 + 0x18);
          paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)paVar18 + 0x28);
        } while (paVar19 !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)uVar4);
        local_f8._8_8_ = uVar3;
      }
      bVar5 = Lexer::ReadEvalString(this_00,(EvalString *)&local_f8,true,err);
    } while (bVar5);
  }
LAB_001177b9:
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
             *)&local_f8);
LAB_001177c6:
  bVar5 = false;
LAB_001177c8:
  std::vector<EvalString,_std::allocator<EvalString>_>::~vector(&local_98);
  std::vector<EvalString,_std::allocator<EvalString>_>::~vector(&local_78);
  return bVar5;
LAB_0011782e:
  local_f8._M_allocated_capacity = 0;
  local_f8._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_e8._M_allocated_capacity = 0;
  bVar5 = Lexer::ReadEvalString(this_00,(EvalString *)&local_f8,true,err);
  if (!bVar5) goto LAB_001177b9;
  if (local_f8._M_allocated_capacity != local_f8._8_8_) goto code_r0x00117872;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
             *)&local_f8);
LAB_00117897:
  if (local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_f8._M_allocated_capacity = (size_type)&local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"expected path","");
    bVar5 = Lexer::Error(this_00,(string *)&local_f8,err);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_allocated_capacity == &local_e8) goto LAB_001177c8;
LAB_00117c3b:
    operator_delete((void *)local_f8._M_allocated_capacity,local_e8._M_allocated_capacity + 1);
    goto LAB_001177c8;
  }
  bVar5 = Parser::ExpectToken(&local_150->super_Parser,COLON,err);
  if (!bVar5) goto LAB_001177c6;
  local_f8._M_allocated_capacity = (size_type)&local_e8;
  local_f8._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_e8._M_allocated_capacity = local_e8._M_allocated_capacity & 0xffffffffffffff00;
  local_120 = err;
  bVar5 = Lexer::ReadIdent(this_00,(string *)&local_f8);
  if (bVar5) {
    pRVar8 = BindingEnv::LookupRule(local_150->env_,(string *)&local_f8);
    if (pRVar8 == (Rule *)0x0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                     "unknown build rule \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8)
      ;
      plVar11 = (long *)std::__cxx11::string::append(local_170);
      pNVar13 = (Node *)(plVar11 + 2);
      if ((Node *)*plVar11 == pNVar13) {
        local_148._16_8_ = (pNVar13->path_)._M_dataplus._M_p;
        local_148._24_8_ = plVar11[3];
        local_148._0_8_ = (Node *)(local_148 + 0x10);
      }
      else {
        local_148._16_8_ = (pNVar13->path_)._M_dataplus._M_p;
        local_148._0_8_ = (Node *)*plVar11;
      }
      local_148._8_8_ = plVar11[1];
      *plVar11 = (long)pNVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      bVar5 = Lexer::Error(this_00,(string *)local_148,local_120);
      if ((Node *)local_148._0_8_ != (Node *)(local_148 + 0x10)) {
        operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
      }
      ppVar20 = (pointer)local_170._16_8_;
      pNVar13 = (Node *)local_170._0_8_;
      if ((Node *)local_170._0_8_ != (Node *)(local_170 + 0x10)) goto LAB_00117b75;
    }
    else {
      local_60 = pRVar8;
      while( true ) {
        local_148._0_8_ = (Node *)0x0;
        local_148._8_8_ = (Node *)0x0;
        local_148._16_8_ = (pointer)0x0;
        bVar5 = Lexer::ReadEvalString(this_00,(EvalString *)local_148,true,local_120);
        if (!bVar5) break;
        if (local_148._0_8_ == local_148._8_8_) {
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                     *)local_148);
          bVar5 = Lexer::PeekToken(this_00,PIPE);
          local_cc = 0;
          if (bVar5) {
            local_cc = 0;
            while( true ) {
              local_148._0_8_ = (Node *)0x0;
              local_148._8_8_ = (Node *)0x0;
              local_148._16_8_ = (pointer)0x0;
              bVar5 = Lexer::ReadEvalString(this_00,(EvalString *)local_148,true,local_120);
              if (!bVar5) goto LAB_00117c16;
              if (local_148._0_8_ == local_148._8_8_) break;
              std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                        (&local_78,(EvalString *)local_148);
              local_cc = local_cc + 1;
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                         *)local_148);
            }
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
            ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                       *)local_148);
          }
          bVar5 = Lexer::PeekToken(this_00,PIPE2);
          local_d0 = 0;
          if (bVar5) {
            local_d0 = 0;
            while( true ) {
              local_148._0_8_ = (Node *)0x0;
              local_148._8_8_ = (Node *)0x0;
              local_148._16_8_ = (pointer)0x0;
              bVar5 = Lexer::ReadEvalString(this_00,(EvalString *)local_148,true,local_120);
              if (!bVar5) goto LAB_00117c16;
              if (local_148._0_8_ == local_148._8_8_) break;
              std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                        (&local_78,(EvalString *)local_148);
              local_d0 = local_d0 + 1;
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                         *)local_148);
            }
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
            ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                       *)local_148);
          }
          bVar5 = Parser::ExpectToken(&local_150->super_Parser,NEWLINE,local_120);
          if (bVar5) {
            bVar6 = Lexer::PeekToken(this_00,INDENT);
            if (bVar6) {
              local_c8 = (BindingEnv *)operator_new(0x70);
              pBVar2 = local_150->env_;
              (local_c8->super_Env)._vptr_Env = (_func_int **)&PTR__BindingEnv_0012bcf0;
              p_Var15 = &(local_c8->bindings_)._M_t._M_impl.super__Rb_tree_header;
              (local_c8->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              (local_c8->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
              (local_c8->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &p_Var15->_M_header;
              (local_c8->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   &p_Var15->_M_header;
              (local_c8->bindings_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              p_Var15 = &(local_c8->rules_)._M_t._M_impl.super__Rb_tree_header;
              (local_c8->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              (local_c8->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
              (local_c8->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &p_Var15->_M_header;
              (local_c8->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   &p_Var15->_M_header;
              (local_c8->rules_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_c8->parent_ = pBVar2;
            }
            else {
              local_c8 = local_150->env_;
            }
            while (bVar6 != false) {
              local_148._0_8_ = local_148 + 0x10;
              local_148._8_8_ = (Node *)0x0;
              local_148._16_8_ = local_148._16_8_ & 0xffffffffffffff00;
              local_118._16_8_ = (pointer)0x0;
              local_118._0_8_ = (Node *)0x0;
              local_118._8_8_ = (pointer)0x0;
              bVar7 = ParseLet(local_150,(string *)local_148,(EvalString *)local_118,local_120);
              bVar6 = true;
              if (bVar7) {
                EvalString::Evaluate_abi_cxx11_
                          ((string *)local_170,(EvalString *)local_118,&local_150->env_->super_Env);
                BindingEnv::AddBinding(local_c8,(string *)local_148,(string *)local_170);
                if ((Node *)local_170._0_8_ != (Node *)(local_170 + 0x10)) {
                  operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
                }
                bVar6 = Lexer::PeekToken(this_00,INDENT);
              }
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                         *)local_118);
              if ((Node *)local_148._0_8_ != (Node *)(local_148 + 0x10)) {
                operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
              }
              bVar5 = false;
              if (!bVar7) goto LAB_00117c22;
            }
            pEVar9 = State::AddEdge((local_150->super_Parser).state_,local_60);
            pEVar9->env_ = local_c8;
            local_170._0_8_ = local_170 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"pool","");
            Edge::GetBinding((string *)local_148,pEVar9,(string *)local_170);
            if ((Node *)local_170._0_8_ != (Node *)(local_170 + 0x10)) {
              operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
            }
            if ((Node *)local_148._8_8_ == (Node *)0x0) {
LAB_00117e7d:
              std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                        (&pEVar9->outputs_,
                         ((long)local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555);
              local_c0 = pEVar9;
              if ((long)local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl
                        .super__Vector_impl_data._M_finish -
                  (long)local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl
                        .super__Vector_impl_data._M_start == 0) {
                bVar5 = false;
              }
              else {
                uVar16 = ((long)local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555;
                bVar5 = false;
                pRVar8 = (Rule *)0x0;
                do {
                  local_60 = pRVar8;
                  EvalString::Evaluate_abi_cxx11_
                            ((string *)local_170,
                             (EvalString *)
                             ((long)&(pRVar8->name_)._M_dataplus._M_p +
                             (long)&((local_98.
                                      super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->parsed_).
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                    ._M_impl),&local_c8->super_Env);
                  local_118._0_8_ = local_118 + 0x10;
                  local_118._8_8_ = (pointer)0x0;
                  local_118._16_8_ = local_118._16_8_ & 0xffffffffffffff00;
                  bVar6 = CanonicalizePath((string *)local_170,&local_38,(string *)local_118);
                  if (bVar6) {
                    path.len_ = local_170._8_8_;
                    path.str_ = (char *)local_170._0_8_;
                    bVar7 = State::AddOut((local_150->super_Parser).state_,local_c0,path,local_38);
                    bVar6 = true;
                    if (!bVar7) {
                      if (*(int *)&local_150->options_ == 1) {
                        std::operator+(&local_58,"multiple rules generate ",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_170);
                        plVar11 = (long *)std::__cxx11::string::append((char *)&local_58);
                        psVar17 = (size_type *)(plVar11 + 2);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*plVar11 ==
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)psVar17) {
                          local_b8.field_2._M_allocated_capacity = *psVar17;
                          local_b8.field_2._8_8_ = plVar11[3];
                          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
                        }
                        else {
                          local_b8.field_2._M_allocated_capacity = *psVar17;
                          local_b8._M_dataplus._M_p = (pointer)*plVar11;
                        }
                        local_b8._M_string_length = plVar11[1];
                        *plVar11 = (long)psVar17;
                        plVar11[1] = 0;
                        *(undefined1 *)(plVar11 + 2) = 0;
                        Lexer::Error(this_00,&local_b8,local_120);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                          operator_delete(local_b8._M_dataplus._M_p,
                                          local_b8.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_58._M_dataplus._M_p != &local_58.field_2) {
                          operator_delete(local_58._M_dataplus._M_p,
                                          local_58.field_2._M_allocated_capacity + 1);
                        }
                        bVar6 = false;
                        bVar5 = false;
                      }
                      else {
                        if (local_150->quiet_ == false) {
                          Warning("multiple rules generate %s. builds involving this target will not be correct; continuing anyway [-w dupbuild=warn]"
                                  ,local_170._0_8_);
                        }
                        iVar21 = iVar21 + -1 + (uint)((ulong)(long)iVar21 < uVar16);
                      }
                    }
                  }
                  else {
                    bVar5 = Lexer::Error(this_00,(string *)local_118,local_120);
                    bVar6 = false;
                  }
                  if ((Node *)local_118._0_8_ != (Node *)(local_118 + 0x10)) {
                    operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
                  }
                  if ((Node *)local_170._0_8_ != (Node *)(local_170 + 0x10)) {
                    operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
                  }
                  if (!bVar6) goto LAB_0011849d;
                  pRVar8 = (Rule *)((long)&(local_60->name_).field_2 + 8);
                  uVar16 = uVar16 - 1;
                } while (uVar16 != 0);
              }
              pEVar9 = local_c0;
              if ((local_c0->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  (local_c0->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                pppEVar1 = &(((local_150->super_Parser).state_)->edges_).
                            super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                *pppEVar1 = *pppEVar1 + -1;
                Edge::~Edge(local_c0);
                operator_delete(pEVar9,0x68);
                bVar5 = true;
              }
              else {
                local_c0->implicit_outs_ = iVar21;
                std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                          (&local_c0->inputs_,
                           ((long)local_78.
                                  super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_78.
                                  super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x5555555555555555);
                if (local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  this_01 = local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  do {
                    EvalString::Evaluate_abi_cxx11_
                              ((string *)local_170,this_01,&local_c8->super_Env);
                    local_118._0_8_ = local_118 + 0x10;
                    local_118._8_8_ = (pointer)0x0;
                    local_118._16_8_ = local_118._16_8_ & 0xffffffffffffff00;
                    bVar6 = CanonicalizePath((string *)local_170,(uint64_t *)&local_b8,
                                             (string *)local_118);
                    if (bVar6) {
                      path_00.len_ = local_170._8_8_;
                      path_00.str_ = (char *)local_170._0_8_;
                      State::AddIn((local_150->super_Parser).state_,local_c0,path_00,
                                   (uint64_t)local_b8._M_dataplus._M_p);
                    }
                    else {
                      bVar5 = Lexer::Error(this_00,(string *)local_118,local_120);
                    }
                    if ((Node *)local_118._0_8_ != (Node *)(local_118 + 0x10)) {
                      operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
                    }
                    if ((Node *)local_170._0_8_ != (Node *)(local_170 + 0x10)) {
                      operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
                    }
                    if (!bVar6) goto LAB_0011849d;
                    this_01 = this_01 + 1;
                  } while (this_01 !=
                           local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                           _M_impl.super__Vector_impl_data._M_finish);
                }
                pEVar9 = local_c0;
                local_c0->implicit_deps_ = local_cc;
                local_c0->order_only_deps_ = local_d0;
                if ((*(int *)&local_150->field_0x54 == 0) &&
                   (bVar5 = Edge::maybe_phonycycle_diagnostic(local_c0), bVar5)) {
                  local_170._0_8_ =
                       *(pEVar9->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
                  _Var12 = std::
                           __remove_if<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,__gnu_cxx::__ops::_Iter_equals_val<Node*const>>
                                     ((__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                       )(pEVar9->inputs_).
                                        super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                        super__Vector_impl_data._M_start,
                                      (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                       )(pEVar9->inputs_).
                                        super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                        super__Vector_impl_data._M_finish,
                                      (_Iter_equals_val<Node_*const>)local_170);
                  if ((_Var12._M_current !=
                       (pEVar9->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                       .super__Vector_impl_data._M_finish) &&
                     ((pEVar9->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_finish = _Var12._M_current,
                     local_150->quiet_ == false)) {
                    Warning("phony target \'%s\' names itself as an input; ignoring [-w phonycycle=warn]"
                            ,*(undefined8 *)local_170._0_8_);
                  }
                }
                Edge::GetUnescapedDyndep_abi_cxx11_((string *)local_170,pEVar9);
                bVar5 = true;
                if (local_170._8_8_ != 0) {
                  bVar6 = CanonicalizePath((string *)local_170,(uint64_t *)&local_58,local_120);
                  if (bVar6) {
                    path_01.len_ = local_170._8_8_;
                    path_01.str_ = (char *)local_170._0_8_;
                    pNVar13 = State::GetNode((local_150->super_Parser).state_,path_01,
                                             (uint64_t)local_58._M_dataplus._M_p);
                    pEVar9->dyndep_ = pNVar13;
                    pNVar13->dyndep_pending_ = true;
                    _Var12 = std::
                             __find_if<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,__gnu_cxx::__ops::_Iter_equals_val<Node*const>>
                                       ((pEVar9->inputs_).
                                        super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                        super__Vector_impl_data._M_start,
                                        (pEVar9->inputs_).
                                        super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                        super__Vector_impl_data._M_finish,&pEVar9->dyndep_);
                    if (_Var12._M_current ==
                        (pEVar9->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
                      std::operator+(&local_b8,"dyndep \'",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_170);
                      puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
                      pNVar13 = (Node *)(puVar14 + 2);
                      if ((Node *)*puVar14 == pNVar13) {
                        local_118._16_8_ = (pNVar13->path_)._M_dataplus._M_p;
                        local_118._24_8_ = puVar14[3];
                        local_118._0_8_ = (Node *)(local_118 + 0x10);
                      }
                      else {
                        local_118._16_8_ = (pNVar13->path_)._M_dataplus._M_p;
                        local_118._0_8_ = (Node *)*puVar14;
                      }
                      local_118._8_8_ = puVar14[1];
                      *puVar14 = pNVar13;
                      puVar14[1] = 0;
                      *(undefined1 *)(puVar14 + 2) = 0;
                      bVar5 = Lexer::Error(this_00,(string *)local_118,local_120);
                      if ((Node *)local_118._0_8_ != (Node *)(local_118 + 0x10)) {
                        operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                        operator_delete(local_b8._M_dataplus._M_p,
                                        local_b8.field_2._M_allocated_capacity + 1);
                      }
                    }
                  }
                  else {
                    bVar5 = false;
                  }
                }
                ppVar20 = (pointer)local_170._16_8_;
                pNVar13 = (Node *)local_170._0_8_;
                if ((Node *)local_170._0_8_ != (Node *)(local_170 + 0x10)) goto LAB_00118495;
              }
            }
            else {
              pPVar10 = State::LookupPool((local_150->super_Parser).state_,(string *)local_148);
              if (pPVar10 != (Pool *)0x0) {
                pEVar9->pool_ = pPVar10;
                goto LAB_00117e7d;
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_118,"unknown pool name \'",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_148);
              puVar14 = (undefined8 *)std::__cxx11::string::append(local_118);
              local_170._0_8_ = local_170 + 0x10;
              pNVar13 = (Node *)(puVar14 + 2);
              if ((Node *)*puVar14 == pNVar13) {
                local_170._16_8_ = (pNVar13->path_)._M_dataplus._M_p;
                local_170._24_8_ = puVar14[3];
              }
              else {
                local_170._16_8_ = (pNVar13->path_)._M_dataplus._M_p;
                local_170._0_8_ = (Node *)*puVar14;
              }
              local_170._8_8_ = puVar14[1];
              *puVar14 = pNVar13;
              puVar14[1] = 0;
              *(undefined1 *)(puVar14 + 2) = 0;
              bVar5 = Lexer::Error(this_00,(string *)local_170,local_120);
              if ((Node *)local_170._0_8_ != (Node *)(local_170 + 0x10)) {
                operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
              }
              ppVar20 = (pointer)local_118._16_8_;
              pNVar13 = (Node *)local_118._0_8_;
              if ((Node *)local_118._0_8_ == (Node *)(local_118 + 0x10)) goto LAB_0011849d;
LAB_00118495:
              operator_delete(pNVar13,(ulong)((long)&(ppVar20->first)._M_dataplus._M_p + 1));
            }
LAB_0011849d:
            ppVar20 = (pointer)local_148._16_8_;
            pNVar13 = (Node *)local_148._0_8_;
            if ((Node *)local_148._0_8_ != (Node *)(local_148 + 0x10)) goto LAB_00117b75;
            goto LAB_00117c22;
          }
          goto LAB_00117c20;
        }
        std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                  (&local_78,(EvalString *)local_148);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                   *)local_148);
      }
LAB_00117c16:
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                 *)local_148);
LAB_00117c20:
      bVar5 = false;
    }
  }
  else {
    local_148._0_8_ = (Node *)(local_148 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_148,"expected build command name","");
    bVar5 = Lexer::Error(this_00,(string *)local_148,local_120);
    ppVar20 = (pointer)local_148._16_8_;
    pNVar13 = (Node *)local_148._0_8_;
    if ((Node *)local_148._0_8_ == (Node *)(local_148 + 0x10)) goto LAB_00117c22;
LAB_00117b75:
    operator_delete(pNVar13,(ulong)((long)&(ppVar20->first)._M_dataplus._M_p + 1));
  }
LAB_00117c22:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_allocated_capacity == &local_e8) goto LAB_001177c8;
  goto LAB_00117c3b;
code_r0x00117872:
  std::vector<EvalString,_std::allocator<EvalString>_>::push_back(&local_98,(value_type *)&local_f8)
  ;
  iVar21 = iVar21 + 1;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
             *)&local_f8);
  goto LAB_0011782e;
}

Assistant:

bool ManifestParser::ParseEdge(string* err) {
  vector<EvalString> ins, outs;

  {
    EvalString out;
    if (!lexer_.ReadPath(&out, err))
      return false;
    while (!out.empty()) {
      outs.push_back(out);

      out.Clear();
      if (!lexer_.ReadPath(&out, err))
        return false;
    }
  }

  // Add all implicit outs, counting how many as we go.
  int implicit_outs = 0;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString out;
      if (!lexer_.ReadPath(&out, err))
        return false;
      if (out.empty())
        break;
      outs.push_back(out);
      ++implicit_outs;
    }
  }

  if (outs.empty())
    return lexer_.Error("expected path", err);

  if (!ExpectToken(Lexer::COLON, err))
    return false;

  string rule_name;
  if (!lexer_.ReadIdent(&rule_name))
    return lexer_.Error("expected build command name", err);

  const Rule* rule = env_->LookupRule(rule_name);
  if (!rule)
    return lexer_.Error("unknown build rule '" + rule_name + "'", err);

  for (;;) {
    // XXX should we require one path here?
    EvalString in;
    if (!lexer_.ReadPath(&in, err))
      return false;
    if (in.empty())
      break;
    ins.push_back(in);
  }

  // Add all implicit deps, counting how many as we go.
  int implicit = 0;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString in;
      if (!lexer_.ReadPath(&in, err))
        return false;
      if (in.empty())
        break;
      ins.push_back(in);
      ++implicit;
    }
  }

  // Add all order-only deps, counting how many as we go.
  int order_only = 0;
  if (lexer_.PeekToken(Lexer::PIPE2)) {
    for (;;) {
      EvalString in;
      if (!lexer_.ReadPath(&in, err))
        return false;
      if (in.empty())
        break;
      ins.push_back(in);
      ++order_only;
    }
  }

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  // Bindings on edges are rare, so allocate per-edge envs only when needed.
  bool has_indent_token = lexer_.PeekToken(Lexer::INDENT);
  BindingEnv* env = has_indent_token ? new BindingEnv(env_) : env_;
  while (has_indent_token) {
    string key;
    EvalString val;
    if (!ParseLet(&key, &val, err))
      return false;

    env->AddBinding(key, val.Evaluate(env_));
    has_indent_token = lexer_.PeekToken(Lexer::INDENT);
  }

  Edge* edge = state_->AddEdge(rule);
  edge->env_ = env;

  string pool_name = edge->GetBinding("pool");
  if (!pool_name.empty()) {
    Pool* pool = state_->LookupPool(pool_name);
    if (pool == NULL)
      return lexer_.Error("unknown pool name '" + pool_name + "'", err);
    edge->pool_ = pool;
  }

  edge->outputs_.reserve(outs.size());
  for (size_t i = 0, e = outs.size(); i != e; ++i) {
    string path = outs[i].Evaluate(env);
    string path_err;
    uint64_t slash_bits;
    if (!CanonicalizePath(&path, &slash_bits, &path_err))
      return lexer_.Error(path_err, err);
    if (!state_->AddOut(edge, path, slash_bits)) {
      if (options_.dupe_edge_action_ == kDupeEdgeActionError) {
        lexer_.Error("multiple rules generate " + path + " [-w dupbuild=err]",
                     err);
        return false;
      } else {
        if (!quiet_) {
          Warning("multiple rules generate %s. "
                  "builds involving this target will not be correct; "
                  "continuing anyway [-w dupbuild=warn]",
                  path.c_str());
        }
        if (e - i <= static_cast<size_t>(implicit_outs))
          --implicit_outs;
      }
    }
  }
  if (edge->outputs_.empty()) {
    // All outputs of the edge are already created by other edges. Don't add
    // this edge.  Do this check before input nodes are connected to the edge.
    state_->edges_.pop_back();
    delete edge;
    return true;
  }
  edge->implicit_outs_ = implicit_outs;

  edge->inputs_.reserve(ins.size());
  for (vector<EvalString>::iterator i = ins.begin(); i != ins.end(); ++i) {
    string path = i->Evaluate(env);
    string path_err;
    uint64_t slash_bits;
    if (!CanonicalizePath(&path, &slash_bits, &path_err))
      return lexer_.Error(path_err, err);
    state_->AddIn(edge, path, slash_bits);
  }
  edge->implicit_deps_ = implicit;
  edge->order_only_deps_ = order_only;

  if (options_.phony_cycle_action_ == kPhonyCycleActionWarn &&
      edge->maybe_phonycycle_diagnostic()) {
    // CMake 2.8.12.x and 3.0.x incorrectly write phony build statements
    // that reference themselves.  Ninja used to tolerate these in the
    // build graph but that has since been fixed.  Filter them out to
    // support users of those old CMake versions.
    Node* out = edge->outputs_[0];
    vector<Node*>::iterator new_end =
        remove(edge->inputs_.begin(), edge->inputs_.end(), out);
    if (new_end != edge->inputs_.end()) {
      edge->inputs_.erase(new_end, edge->inputs_.end());
      if (!quiet_) {
        Warning("phony target '%s' names itself as an input; "
                "ignoring [-w phonycycle=warn]",
                out->path().c_str());
      }
    }
  }

  // Lookup, validate, and save any dyndep binding.  It will be used later
  // to load generated dependency information dynamically, but it must
  // be one of our manifest-specified inputs.
  string dyndep = edge->GetUnescapedDyndep();
  if (!dyndep.empty()) {
    uint64_t slash_bits;
    if (!CanonicalizePath(&dyndep, &slash_bits, err))
      return false;
    edge->dyndep_ = state_->GetNode(dyndep, slash_bits);
    edge->dyndep_->set_dyndep_pending(true);
    vector<Node*>::iterator dgi =
      std::find(edge->inputs_.begin(), edge->inputs_.end(), edge->dyndep_);
    if (dgi == edge->inputs_.end()) {
      return lexer_.Error("dyndep '" + dyndep + "' is not an input", err);
    }
  }

  return true;
}